

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O1

bool __thiscall
Am_Object_Data::notify_unique(Am_Object_Data *this,Am_Slot_Key key,Am_Wrapper *new_value)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  byte bVar5;
  Am_Object_Data *pAVar6;
  
  uVar1 = (this->data).length;
  if (uVar1 != 0) {
    lVar4 = 0;
    do {
      lVar2 = *(long *)((this->data).data + lVar4 * 8);
      if (*(Am_Slot_Key *)(lVar2 + 0x30) == key) {
        if ((*(byte *)(lVar2 + 0x38) & 2) == 0) {
          return true;
        }
        if (new_value != (Am_Wrapper *)0x0) {
          new_value->refs = new_value->refs + 1;
        }
        *(Am_Wrapper **)(lVar2 + 8) = new_value;
        if ((*(byte *)(lVar2 + 0x38) & 1) == 0) {
          return false;
        }
        pAVar6 = this->first_instance;
        if (pAVar6 != (Am_Object_Data *)0x0) {
          bVar5 = 1;
          do {
            bVar3 = notify_unique(pAVar6,key,new_value);
            bVar5 = bVar5 & bVar3;
            pAVar6 = pAVar6->next_instance;
          } while (pAVar6 != (Am_Object_Data *)0x0);
          if (bVar5 == 0) {
            return false;
          }
        }
        *(byte *)(lVar2 + 0x38) = *(byte *)(lVar2 + 0x38) & 0xfe;
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (uVar1 != (uint)lVar4);
  }
  for (pAVar6 = this->first_instance; pAVar6 != (Am_Object_Data *)0x0;
      pAVar6 = pAVar6->next_instance) {
    notify_unique(pAVar6,key,new_value);
  }
  return false;
}

Assistant:

bool
Am_Object_Data::notify_unique(Am_Slot_Key key, Am_Wrapper *new_value)
{
  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = data.length, slot_array = (Am_Slot_Data **)data.data; i > 0;
       --i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key) {
      if (slot->flags & BIT_INHERITS) {
        if (new_value)
          new_value->Note_Reference();
        slot->value.wrapper_value = new_value;
        if (slot->flags & BIT_IS_INHERITED)
          if (propagate_unique(key, new_value))
            slot->flags &= ~BIT_IS_INHERITED;
        return false;
      } else
        return true;
    }
  }
  propagate_unique(key, new_value);
  return false;
}